

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

bool __thiscall FBX::Decoder::readNode(Decoder *this,Node *node)

{
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this_00;
  Stream *this_01;
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  runtime_error *this_02;
  long lVar8;
  size_t i;
  ulong uVar9;
  char *pcVar10;
  Span<char> local_a0;
  Node child;
  
  iVar3 = readuInt(this);
  if (iVar3 != 0) {
    uVar5 = (ulong)iVar3;
    iVar4 = readuInt(this);
    node->propertyCount = (long)iVar4;
    iVar4 = readuInt(this);
    node->propertyLength = (long)iVar4;
    readString_abi_cxx11_((string *)&child,this);
    std::__cxx11::string::operator=((string *)&node->id,(string *)&child);
    std::__cxx11::string::~string((string *)&child);
    this_00 = &node->properties;
    std::
    vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
    ::resize(this_00,node->propertyCount);
    lVar8 = 0;
    for (uVar9 = 0; uVar9 < node->propertyCount; uVar9 = uVar9 + 1) {
      pcVar10 = (this->stream).data;
      sVar6 = (this->stream).cursor;
      (this->stream).cursor = sVar6 + 1;
      cVar1 = pcVar10[sVar6];
      switch(cVar1) {
      case 'C':
        (this->stream).cursor = sVar6 + 2;
        child.propertyCount = CONCAT71(child.propertyCount._1_7_,pcVar10[sVar6 + 1]);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),(bool *)&child);
        break;
      case 'D':
        (this->stream).cursor = sVar6 + 9;
        child.propertyCount = *(size_t *)(pcVar10 + sVar6 + 1);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),(double *)&child);
        break;
      case 'E':
      case 'G':
      case 'H':
      case 'J':
      case 'K':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
        break;
      case 'F':
        (this->stream).cursor = sVar6 + 5;
        child.propertyCount =
             CONCAT44(child.propertyCount._4_4_,*(undefined4 *)(pcVar10 + sVar6 + 1));
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),(float *)&child);
        break;
      case 'I':
        (this->stream).cursor = sVar6 + 5;
        child.propertyCount =
             CONCAT44(child.propertyCount._4_4_,*(undefined4 *)(pcVar10 + sVar6 + 1));
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),(int *)&child);
        break;
      case 'L':
        (this->stream).cursor = sVar6 + 9;
        child.propertyCount = *(size_t *)(pcVar10 + sVar6 + 1);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),(long *)&child);
        break;
      case 'R':
        iVar4 = readuInt(this);
        sVar6 = (this->stream).cursor;
        pcVar10 = (this->stream).data + sVar6;
        (this->stream).cursor = sVar6 + (long)iVar4;
        std::vector<char,std::allocator<char>>::vector<char_const*,void>
                  ((vector<char,std::allocator<char>> *)&child,pcVar10,pcVar10 + iVar4,
                   (allocator_type *)&local_a0);
LAB_0010469c:
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),(vector<char,_std::allocator<char>_> *)&child);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&child);
        break;
      case 'S':
        iVar4 = readuInt(this);
        sVar6 = (this->stream).cursor;
        pcVar10 = (this->stream).data + sVar6;
        (this->stream).cursor = sVar6 + (long)iVar4;
        child.propertyCount = (size_t)&child.id;
        std::__cxx11::string::_M_construct<char_const*>((string *)&child,pcVar10,pcVar10 + iVar4);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_00->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&child);
        std::__cxx11::string::~string((string *)&child);
        break;
      default:
        switch(cVar1) {
        case 'b':
        case 'c':
          readArray<char>((vector<char,_std::allocator<char>_> *)&child,this);
          goto LAB_0010469c;
        case 'd':
          readArray<double>((vector<double,_std::allocator<double>_> *)&child,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_00->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar8),(vector<double,_std::allocator<double>_> *)&child);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&child);
          break;
        case 'e':
        case 'g':
        case 'h':
        case 'j':
        case 'k':
          break;
        case 'f':
          readArray<float>((vector<float,_std::allocator<float>_> *)&child,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_00->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar8),(vector<float,_std::allocator<float>_> *)&child);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&child);
          break;
        case 'i':
          readArray<int>((vector<int,_std::allocator<int>_> *)&child,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_00->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar8),(vector<int,_std::allocator<int>_> *)&child);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&child);
          break;
        case 'l':
          readArray<long>((vector<long,_std::allocator<long>_> *)&child,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_00->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar8),(vector<long,_std::allocator<long>_> *)&child);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    ((_Vector_base<long,_std::allocator<long>_> *)&child);
          break;
        default:
          if (cVar1 == 'Y') {
            (this->stream).cursor = sVar6 + 3;
            child.propertyCount =
                 CONCAT62(child.propertyCount._2_6_,*(undefined2 *)(pcVar10 + sVar6 + 1));
            std::
            variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
            ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         *)((long)&(((this_00->
                                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                   ).
                                   super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                   .
                                   super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                           + lVar8),(short *)&child);
          }
        }
      }
      lVar8 = lVar8 + 0x30;
    }
    this_01 = &this->stream;
    sVar6 = Stream::tell(this_01);
    if (sVar6 < uVar5) {
      while( true ) {
        sVar7 = Stream::tell(this_01);
        sVar6 = this->blockLength;
        if (uVar5 - sVar6 <= sVar7) break;
        Node::Node(&child);
        readNode(this,&child);
        std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back(&node->children,&child);
        Node::~Node(&child);
      }
      sVar7 = (this->stream).cursor;
      child.propertyCount = (size_t)((this->stream).data + sVar7);
      child.propertyLength = child.propertyCount + sVar6;
      (this->stream).cursor = sVar7 + sVar6;
      local_a0.begin =
           (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_a0.end = (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
      bVar2 = Span<char>::operator!=((Span<char> *)&child,&local_a0);
      if (bVar2) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"Failed to read nested block");
        goto LAB_00104896;
      }
    }
    sVar6 = Stream::tell(this_01);
    if (sVar6 < uVar5) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Scope length not reached");
LAB_00104896:
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return iVar3 != 0;
}

Assistant:

bool Decoder::readNode(Node &node) {
        size_t endOffset = readuInt();
        if (endOffset == 0)
            return false;

        node.propertyCount = readuInt();
        node.propertyLength = readuInt();

        node.id = readString();
        node.properties.resize(node.propertyCount);

        for (size_t i = 0; i < node.propertyCount; i++) {
            auto dataType = stream.read<char>();
            switch (dataType) {
                case 'Y':
                    node.properties[i] = stream.read<int16_t>(); /// 16 bit int
                    break;
                case 'C':
                    node.properties[i] = stream.read<bool>(); /// 1 bit bool
                    break;
                case 'I':
                    node.properties[i] = stream.read<int32_t>(); /// 32 bit int
                    break;
                case 'F':
                    node.properties[i] = stream.read<float>(); /// 32 bit float
                    break;
                case 'D':
                    node.properties[i] = stream.read<double>(); /// 64 bit float (double)
                    break;
                case 'L':
                    node.properties[i] = stream.read<int64_t>(); /// 64 bit int
                    break;
                case 'R': {
                    const auto &data = stream.read<char>(readuInt());
                    node.properties[i] = std::vector<char>(data.begin, data.end); /// binary data
                    break;
                }
                case 'S': {
                    const auto &data = stream.read<char>(readuInt());
                    node.properties[i] = std::string(data.begin, data.end); /// string
                    break;
                }
                case 'f':
                    node.properties[i] = readArray<float>(); /// array of 32 bit float
                    break;
                case 'i':
                    node.properties[i] = readArray<int32_t>(); /// array of 32 bit int
                    break;
                case 'd':
                    node.properties[i] = readArray<double>(); /// array of 64 bit float (double)
                    break;
                case 'l':
                    node.properties[i] = readArray<int64_t>(); /// array of 64 bit int
                    break;
                case 'b':
                    node.properties[i] = readArray<char>(); /// array of 1 bit boolean
                    break;
                case 'c':
                    node.properties[i] = readArray<char>(); /// array of bytes
                    break;
                default:
                    break;
            }
        }

        if (stream.tell() < endOffset) {
            while (stream.tell() < (endOffset - blockLength)) {
                Node child;
                readNode(child);
                node.children.push_back(child);
            }

            if (stream.read<char>(blockLength) != Span<char>(blockData.data(), blockData.size()))
                throw std::runtime_error("Failed to read nested block");
        }

        if (stream.tell() < endOffset)
            throw std::runtime_error("Scope length not reached");

        return true;
    }